

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prop2octave.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string inname;
  string outname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  Properties prop;
  Parameter param;
  string p;
  char *def [6];
  
  def[4] = "-help # Print help and exit.";
  def[5] = (char *)0x0;
  def[2] = "# Converts a property file (i.e. key=value) into octave text format.";
  def[3] = "#";
  def[0] = "# prop2octave <property-file> [<output-file>]";
  def[1] = "#";
  gutil::Parameter::Parameter(&param,argc,argv,def,(char *)0x0);
  inname._M_dataplus._M_p = (pointer)&inname.field_2;
  inname._M_string_length = 0;
  inname.field_2._M_local_buf[0] = '\0';
  outname._M_dataplus._M_p = (pointer)&outname.field_2;
  outname._M_string_length = 0;
  outname.field_2._M_local_buf[0] = '\0';
  do {
    bVar1 = gutil::Parameter::isNextParameter(&param);
    if (!bVar1) {
      if ((int)((ulong)((long)param.list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)param.list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) - (int)param.pos < 1)
      {
        gutil::Parameter::printHelp(&param,(ostream *)&std::cout,0x50);
        iVar2 = 10;
      }
      else {
        gutil::Parameter::nextString(&param,&inname,(char *)0x0);
        if (0 < (int)((ulong)((long)param.list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)param.list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) - (int)param.pos
           ) {
          gutil::Parameter::nextString(&param,&outname,(char *)0x0);
        }
        gutil::Properties::Properties(&prop,inname._M_dataplus._M_p);
        if (outname._M_string_length == 0) {
          std::operator+(&p,"Converted from ",&inname);
          gutil::Properties::saveOctave(&prop,(ostream *)&std::cout,p._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&p);
        }
        else {
          std::ofstream::ofstream(&p);
          std::ios::exceptions((int)&p + (int)*(undefined8 *)(p._M_dataplus._M_p + -0x18));
          std::ofstream::open((string *)&p,(_Ios_Openmode)&outname);
          std::operator+(&local_338,"Converted from ",&inname);
          gutil::Properties::saveOctave(&prop,(ostream *)&p,local_338._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_338);
          std::ofstream::close();
          std::ofstream::~ofstream(&p);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&prop);
LAB_0010996d:
        iVar2 = 0;
      }
      std::__cxx11::string::~string((string *)&outname);
      std::__cxx11::string::~string((string *)&inname);
      gutil::Parameter::~Parameter(&param);
      return iVar2;
    }
    p._M_string_length = 0;
    p.field_2._M_local_buf[0] = '\0';
    p._M_dataplus._M_p = (pointer)&p.field_2;
    gutil::Parameter::nextParameter(&param,&p);
    bVar1 = std::operator==(&p,"-help");
    if (bVar1) {
      gutil::Parameter::printHelp(&param,(ostream *)&std::cout,0x50);
      std::__cxx11::string::~string((string *)&p);
      goto LAB_0010996d;
    }
    std::__cxx11::string::~string((string *)&p);
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
  try
  {
    const char *def[]=
    {
      "# prop2octave <property-file> [<output-file>]",
      "#",
      "# Converts a property file (i.e. key=value) into octave text format.",
      "#",
      "-help # Print help and exit.",
      0
    };

    gutil::Parameter param(argc, argv, def);

    // handle options

    std::string inname;
    std::string outname;

    while (param.isNextParameter())
    {
      std::string p;

      param.nextParameter(p);

      if (p == "-help")
      {
        param.printHelp(std::cout);
        return 0;
      }
    }

    if (param.remaining() < 1)
    {
      param.printHelp(std::cout);
      return 10;
    }

    param.nextString(inname);

    if (param.remaining() > 0)
    {
      param.nextString(outname);
    }

    // load properties file

    gutil::Properties prop(inname.c_str());

    if (outname.size() > 0)
    {
      std::ofstream out;

      out.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      out.open(outname);

      prop.saveOctave(out, ("Converted from "+inname).c_str());

      out.close();
    }
    else
    {
      prop.saveOctave(std::cout, ("Converted from "+inname).c_str());
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
  }
}